

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_translation_unit_tree(FILE *out,AST_Translation_Unit *unit)

{
  AST *tree;
  AST *hold;
  Queue_Node *it;
  AST_Translation_Unit *unit_local;
  FILE *out_local;
  
  for (hold = (AST *)(unit->components).first; hold != (AST *)0x0; hold = *(AST **)(hold + 2)) {
    tree = *(AST **)hold;
    print_ast(out,tree);
    if (tree->type != ST_FUNCTION_DEFINITION) {
      fprintf((FILE *)out,";\n");
    }
  }
  return;
}

Assistant:

void print_translation_unit_tree(FILE *out,struct AST_Translation_Unit *unit)
{
	struct Queue_Node *it;	
	struct AST* hold;
	for(it=unit->components.first;it!=NULL;it=it->prev)
	{
		hold=(struct AST*)(it->data);
		print_ast(out,hold);
		if(hold->type!=ST_FUNCTION_DEFINITION)
		{
			fprintf(out,";\n");
		}
	}
}